

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O1

SubpassDescription * __thiscall
vkt::Draw::SubpassDescription::operator=(SubpassDescription *this,SubpassDescription *rhs)

{
  pointer pVVar1;
  pointer puVar2;
  VkPipelineBindPoint VVar3;
  long lVar4;
  SubpassDescription *pSVar5;
  SubpassDescription *pSVar6;
  
  pSVar5 = rhs;
  pSVar6 = this;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    VVar3 = (pSVar5->super_VkSubpassDescription).pipelineBindPoint;
    (pSVar6->super_VkSubpassDescription).flags = (pSVar5->super_VkSubpassDescription).flags;
    (pSVar6->super_VkSubpassDescription).pipelineBindPoint = VVar3;
    pSVar5 = (SubpassDescription *)&(pSVar5->super_VkSubpassDescription).inputAttachmentCount;
    pSVar6 = (SubpassDescription *)&(pSVar6->super_VkSubpassDescription).inputAttachmentCount;
  }
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::operator=
            (&this->m_inputAttachments,&rhs->m_inputAttachments);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::operator=
            (&this->m_colorAttachments,&rhs->m_colorAttachments);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::operator=
            (&this->m_resolveAttachments,&rhs->m_resolveAttachments);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->m_preserveAttachments,&rhs->m_preserveAttachments);
  this->m_depthStencilAttachment = rhs->m_depthStencilAttachment;
  pVVar1 = (this->m_inputAttachments).
           super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (this->m_inputAttachments).
                super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (this->super_VkSubpassDescription).pInputAttachments = pVVar1;
  }
  pVVar1 = (this->m_colorAttachments).
           super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (this->m_colorAttachments).
                super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (this->super_VkSubpassDescription).pColorAttachments = pVVar1;
  }
  pVVar1 = (this->m_resolveAttachments).
           super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (this->m_resolveAttachments).
                super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (this->super_VkSubpassDescription).pResolveAttachments = pVVar1;
  }
  (this->super_VkSubpassDescription).pDepthStencilAttachment = &this->m_depthStencilAttachment;
  puVar2 = (this->m_preserveAttachments).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (this->m_preserveAttachments).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    (this->super_VkSubpassDescription).pPreserveAttachments = puVar2;
  }
  return this;
}

Assistant:

SubpassDescription& SubpassDescription::operator= (const SubpassDescription& rhs)
{
	*static_cast<vk::VkSubpassDescription*>(this) = rhs;

	m_inputAttachments		= rhs.m_inputAttachments;
	m_colorAttachments		= rhs.m_colorAttachments;
	m_resolveAttachments	= rhs.m_resolveAttachments;
	m_preserveAttachments	= rhs.m_preserveAttachments;
	m_depthStencilAttachment = rhs.m_depthStencilAttachment;

	if (!m_inputAttachments.empty())
		pInputAttachments = &m_inputAttachments[0];

	if (!m_colorAttachments.empty())
		pColorAttachments = &m_colorAttachments[0];

	if (!m_resolveAttachments.empty())
		pResolveAttachments = &m_resolveAttachments[0];

	pDepthStencilAttachment = &m_depthStencilAttachment;

	if (!m_preserveAttachments.empty())
		pPreserveAttachments = &m_preserveAttachments[0];

	return *this;
}